

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

int lua_setmetatable(lua_State *L,int objindex)

{
  uint uVar1;
  TValue *pTVar2;
  GCObject *o;
  GCObject *v;
  
  pTVar2 = index2addr(L,objindex);
  if (L->top[-1].tt_ == 0) {
    v = (GCObject *)0x0;
  }
  else {
    v = L->top[-1].value_.gc;
  }
  uVar1 = pTVar2->tt_ & 0xf;
  if ((ulong)uVar1 == 7) {
    *(GCObject **)((pTVar2->value_).f + 0x10) = v;
    if (v == (GCObject *)0x0) goto LAB_00106088;
    o = (pTVar2->value_).gc;
    if ((((v->gch).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      luaC_barrier_(L,o,v);
      goto LAB_0010606c;
    }
  }
  else {
    if (uVar1 != 5) {
      L->l_G->mt[uVar1] = (Table *)v;
      goto LAB_00106088;
    }
    *(GCObject **)((pTVar2->value_).f + 0x10) = v;
    if (((v != (GCObject *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((pTVar2->value_).gc)->gch).marked & 4) != 0)) {
      luaC_barrierback_(L,(pTVar2->value_).gc);
    }
LAB_0010606c:
    o = (pTVar2->value_).gc;
  }
  luaC_checkfinalizer(L,o,&v->h);
LAB_00106088:
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable (lua_State *L, int objindex) {
  TValue *obj;
  Table *mt;
  lua_lock(L);
  api_checknelems(L, 1);
  obj = index2addr(L, objindex);
  api_checkvalidindex(L, obj);
  if (ttisnil(L->top - 1))
    mt = NULL;
  else {
    api_check(L, ttistable(L->top - 1), "table expected");
    mt = hvalue(L->top - 1);
  }
  switch (ttypenv(obj)) {
    case LUA_TTABLE: {
      hvalue(obj)->metatable = mt;
      if (mt)
        luaC_objbarrierback(L, gcvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      break;
    }
    case LUA_TUSERDATA: {
      uvalue(obj)->metatable = mt;
      if (mt) {
        luaC_objbarrier(L, rawuvalue(obj), mt);
        luaC_checkfinalizer(L, gcvalue(obj), mt);
      }
      break;
    }
    default: {
      G(L)->mt[ttypenv(obj)] = mt;
      break;
    }
  }
  L->top--;
  lua_unlock(L);
  return 1;
}